

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O3

void __thiscall
QStringTokenizerBase<QStringView,_QChar>::iterator::iterator
          (iterator *this,QStringTokenizerBase<QStringView,_QChar> *t)

{
  long lVar1;
  long lVar2;
  long from;
  long lVar3;
  
  this->tokenizer = t;
  lVar1 = 0;
  lVar2 = 0;
  do {
    from = lVar2;
    if (lVar1 < 0) {
      (this->current).value.m_data = (storage_type_conflict *)0x0;
      (this->current).value.m_size = 0;
      (this->current).ok = false;
      goto LAB_0014576e;
    }
    lVar1 = QStringView::indexOf
                      (&t->m_haystack,(QChar)(char16_t)*(undefined4 *)&t->m_needle,from,
                       (t->super_QStringTokenizerBaseBase).m_cs);
    if (lVar1 < 0) {
      lVar2 = from;
      lVar3 = (t->m_haystack).m_size;
    }
    else {
      lVar2 = lVar1 + 1;
      lVar3 = lVar1;
    }
  } while ((((t->super_QStringTokenizerBaseBase).m_sb.
             super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
             super_QFlagsStorage<Qt::SplitBehaviorFlags>.i & 1) != 0) && (lVar3 == from));
  (this->current).value.m_data = (t->m_haystack).m_data + from;
  (this->current).value.m_size = lVar3 - from;
  (this->current).ok = true;
  from = lVar2;
LAB_0014576e:
  (this->current).state.start = from;
  (this->current).state.end = lVar1;
  (this->current).state.extra = 0;
  return;
}

Assistant:

explicit iterator(const QStringTokenizerBase &t) noexcept
            : tokenizer{&t}, current{t.toFront()} {}